

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5WriteInit(Fts5Index *p,Fts5SegWriter *pWriter,int iSegid)

{
  int iVar1;
  sqlite3_stmt *ppStmt;
  undefined4 in_EDX;
  undefined4 *in_RSI;
  sqlite3_stmt *in_RDI;
  Fts5Config *pConfig;
  int nBuffer;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  sqlite3_stmt *in_stack_ffffffffffffffd0;
  Fts5SegWriter *in_stack_ffffffffffffffd8;
  u32 nByte;
  Fts5Index *in_stack_ffffffffffffffe0;
  Fts5Index *p_00;
  
  iVar1 = *(int *)(*(long *)in_RDI + 0xc4) + 0x14;
  memset(in_RSI,0,0x78);
  *in_RSI = in_EDX;
  fts5WriteDlidxGrow(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                     (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  in_RSI[2] = 1;
  *(undefined1 *)((long)in_RSI + 0x4a) = 1;
  in_RSI[0x1c] = 1;
  nByte = (u32)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  sqlite3Fts5BufferSize((int *)CONCAT44(in_EDX,iVar1),(Fts5Buffer *)in_stack_ffffffffffffffe0,nByte)
  ;
  sqlite3Fts5BufferSize((int *)CONCAT44(in_EDX,iVar1),(Fts5Buffer *)in_stack_ffffffffffffffe0,nByte)
  ;
  if (*(long *)(in_RDI + 0x60) == 0) {
    p_00 = *(Fts5Index **)in_RDI;
    ppStmt = in_RDI + 0x60;
    in_stack_ffffffffffffffd0 = in_RDI;
    sqlite3_mprintf("INSERT INTO \'%q\'.\'%q_idx\'(segid,term,pgno) VALUES(?,?,?)",
                    *(undefined8 *)&p_00->nWorkUnit,p_00->pHash);
    fts5IndexPrepareStmt(p_00,(sqlite3_stmt **)ppStmt,(char *)in_stack_ffffffffffffffd0);
  }
  if (*(int *)(in_RDI + 0x3c) == 0) {
    memset(*(void **)(in_RSI + 4),0,4);
    in_RSI[6] = 4;
    sqlite3_bind_int(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static void fts5WriteInit(
  Fts5Index *p,
  Fts5SegWriter *pWriter,
  int iSegid
){
  const int nBuffer = p->pConfig->pgsz + FTS5_DATA_PADDING;

  memset(pWriter, 0, sizeof(Fts5SegWriter));
  pWriter->iSegid = iSegid;

  fts5WriteDlidxGrow(p, pWriter, 1);
  pWriter->writer.pgno = 1;
  pWriter->bFirstTermInPage = 1;
  pWriter->iBtPage = 1;

  assert( pWriter->writer.buf.n==0 );
  assert( pWriter->writer.pgidx.n==0 );

  /* Grow the two buffers to pgsz + padding bytes in size. */
  sqlite3Fts5BufferSize(&p->rc, &pWriter->writer.pgidx, nBuffer);
  sqlite3Fts5BufferSize(&p->rc, &pWriter->writer.buf, nBuffer);

  if( p->pIdxWriter==0 ){
    Fts5Config *pConfig = p->pConfig;
    fts5IndexPrepareStmt(p, &p->pIdxWriter, sqlite3_mprintf(
          "INSERT INTO '%q'.'%q_idx'(segid,term,pgno) VALUES(?,?,?)",
          pConfig->zDb, pConfig->zName
    ));
  }

  if( p->rc==SQLITE_OK ){
    /* Initialize the 4-byte leaf-page header to 0x00. */
    memset(pWriter->writer.buf.p, 0, 4);
    pWriter->writer.buf.n = 4;

    /* Bind the current output segment id to the index-writer. This is an
    ** optimization over binding the same value over and over as rows are
    ** inserted into %_idx by the current writer.  */
    sqlite3_bind_int(p->pIdxWriter, 1, pWriter->iSegid);
  }
}